

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRDisplayNode::waitForRenderToComplete(VRDisplayNode *this,VRDataIndex *renderState)

{
  bool bVar1;
  reference ppVVar2;
  undefined8 in_RSI;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  *in_RDI;
  iterator it;
  vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *in_stack_ffffffffffffffc8
  ;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  in_stack_ffffffffffffffd8;
  __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_18._M_current =
       (VRDisplayNode **)
       std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::end
              (in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
              ::operator*(&local_18);
    (*(*ppVVar2)->_vptr_VRDisplayNode[5])(*ppVVar2,local_10);
    in_stack_ffffffffffffffd8 =
         __gnu_cxx::
         __normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
         ::operator++(in_stack_ffffffffffffffd8._M_current,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void VRDisplayNode::waitForRenderToComplete(VRDataIndex *renderState) {
	for (std::vector<VRDisplayNode*>::iterator it = _children.begin(); it != _children.end(); it++) {
		(*it)->waitForRenderToComplete(renderState);
	}
}